

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall
GEO::Delaunay3d::locate(Delaunay3d *this,double *p,index_t hint,bool thread_safe,Sign *orient)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  index_t iVar4;
  signed_index_t sVar5;
  uint lf_00;
  Sign SVar6;
  uint local_9c;
  index_t lf_1;
  double *pv_bkp;
  index_t t_next;
  signed_index_t s_t_next;
  index_t f;
  index_t df;
  index_t f0;
  double *pv [4];
  Sign orient_local [4];
  index_t local_3c;
  index_t local_38;
  index_t t_pred;
  index_t t;
  index_t lf;
  Sign *orient_local_1;
  bool thread_safe_local;
  index_t hint_local;
  double *p_local;
  Delaunay3d *this_local;
  
  orient_local_1._4_4_ = locate_inexact(this,p,hint,0x9c4);
  if (thread_safe) {
    Process::acquire_spinlock(&locate::lock);
  }
  while (orient_local_1._4_4_ == 0xffffffff) {
    uVar3 = Numeric::random_int32();
    iVar4 = max_t(this);
    orient_local_1._4_4_ = uVar3 % iVar4;
    bVar2 = tet_is_free(this,orient_local_1._4_4_);
    if (bVar2) {
      orient_local_1._4_4_ = 0xffffffff;
    }
  }
  bVar2 = tet_is_virtual(this,orient_local_1._4_4_);
  if (bVar2) {
    for (t_pred = 0; t_pred < 4; t_pred = t_pred + 1) {
      sVar5 = tet_vertex(this,orient_local_1._4_4_,t_pred);
      if (sVar5 == -1) {
        orient_local_1._4_4_ = tet_adjacent(this,orient_local_1._4_4_,t_pred);
        break;
      }
    }
  }
  local_38 = orient_local_1._4_4_;
  local_3c = 0xffffffff;
  _t = (double **)orient;
  if (orient == (Sign *)0x0) {
    _t = pv + 3;
  }
LAB_001d6c0b:
  iVar4 = finite_tet_vertex(this,local_38,0);
  _df = Delaunay::vertex_ptr(&this->super_Delaunay,iVar4);
  iVar4 = finite_tet_vertex(this,local_38,1);
  pv[0] = Delaunay::vertex_ptr(&this->super_Delaunay,iVar4);
  iVar4 = finite_tet_vertex(this,local_38,2);
  pv[1] = Delaunay::vertex_ptr(&this->super_Delaunay,iVar4);
  iVar4 = finite_tet_vertex(this,local_38,3);
  pv[2] = Delaunay::vertex_ptr(&this->super_Delaunay,iVar4);
  uVar3 = Numeric::random_int32();
  s_t_next = 0;
  do {
    if (3 < (uint)s_t_next) {
      if (thread_safe) {
        Process::release_spinlock(&locate::lock);
      }
      return local_38;
    }
    lf_00 = (uVar3 & 3) + s_t_next & 3;
    iVar4 = tet_adjacent(this,local_38,lf_00);
    if (iVar4 == 0xffffffff) {
      if (thread_safe) {
        Process::release_spinlock(&locate::lock);
      }
      return 0xffffffff;
    }
    if (iVar4 == local_3c) {
      *(undefined4 *)((long)_t + (ulong)lf_00 * 4) = 1;
    }
    else {
      uVar1 = *(undefined8 *)(&df + (ulong)lf_00 * 2);
      *(double **)(&df + (ulong)lf_00 * 2) = p;
      SVar6 = PCK::orient_3d(_df,pv[0],pv[1],pv[2]);
      *(Sign *)((long)_t + (ulong)lf_00 * 4) = SVar6;
      if (*(int *)((long)_t + (ulong)lf_00 * 4) == -1) break;
      *(undefined8 *)(&df + (ulong)lf_00 * 2) = uVar1;
    }
    s_t_next = s_t_next + 1;
  } while( true );
  bVar2 = tet_is_virtual(this,iVar4);
  if (bVar2) {
    if (thread_safe) {
      Process::release_spinlock(&locate::lock);
    }
    for (local_9c = 0; local_9c < 4; local_9c = local_9c + 1) {
      *(undefined4 *)((long)_t + (ulong)local_9c * 4) = 1;
    }
    return iVar4;
  }
  local_3c = local_38;
  local_38 = iVar4;
  goto LAB_001d6c0b;
}

Assistant:

index_t Delaunay3d::locate(
        const double* p, index_t hint, bool thread_safe,
        Sign* orient
    ) const {

        //   Try improving the hint by using the 
        // inexact locate function. This gains
        // (a little bit) performance (a few 
        // percent in total Delaunay computation
        // time), but it is better than nothing...
        //   Note: there is a maximum number of tets 
        // traversed by locate_inexact()  (2500)
        // since there exists configurations in which
        // locate_inexact() loops forever !
        hint = locate_inexact(p, hint, 2500);

        static Process::spinlock lock = GEOGRAM_SPINLOCK_INIT;

        // We need to have this spinlock because
        // of random() that is not thread-safe
        // (TODO: implement a random() function with
        //  thread local storage)
        if(thread_safe) {
            Process::acquire_spinlock(lock);
        }

        // If no hint specified, find a tetrahedron randomly
        while(hint == NO_TETRAHEDRON) {
            hint = index_t(Numeric::random_int32()) % max_t();
            if(tet_is_free(hint)) {
                hint = NO_TETRAHEDRON;
            }
        }

        //  Always start from a real tet. If the tet is virtual,
        // find its real neighbor (always opposite to the
        // infinite vertex)
        if(tet_is_virtual(hint)) {
            for(index_t lf = 0; lf < 4; ++lf) {
                if(tet_vertex(hint, lf) == VERTEX_AT_INFINITY) {
                    hint = index_t(tet_adjacent(hint, lf));
                    geo_debug_assert(hint != NO_TETRAHEDRON);
                    break;
                }
            }
        }

        index_t t = hint;
        index_t t_pred = NO_TETRAHEDRON;
        Sign orient_local[4];
        if(orient == nullptr) {
            orient = orient_local;
        }


    still_walking:
        {
            const double* pv[4];
            pv[0] = vertex_ptr(finite_tet_vertex(t,0));
            pv[1] = vertex_ptr(finite_tet_vertex(t,1));
            pv[2] = vertex_ptr(finite_tet_vertex(t,2));
            pv[3] = vertex_ptr(finite_tet_vertex(t,3));
            
            // Start from a random facet
            index_t f0 = index_t(Numeric::random_int32()) % 4;
            for(index_t df = 0; df < 4; ++df) {
                index_t f = (f0 + df) % 4;
                
                signed_index_t s_t_next = tet_adjacent(t,f);

                //  If the opposite tet is -1, then it means that
                // we are trying to locate() (e.g. called from
                // nearest_vertex) within a tetrahedralization 
                // from which the infinite tets were removed.
                if(s_t_next == -1) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    return NO_TETRAHEDRON;
                }

                index_t t_next = index_t(s_t_next);

                //   If the candidate next tetrahedron is the
                // one we came from, then we know already that
                // the orientation is positive, thus we examine
                // the next candidate (or exit the loop if they
                // are exhausted).
                if(t_next == t_pred) {
                    orient[f] = POSITIVE ;
                    continue ; 
                }

                //   To test the orientation of p w.r.t. the facet f of
                // t, we replace vertex number f with p in t (same
                // convention as in CGAL).
                // This is equivalent to tet_facet_point_orient3d(t,f,p)
                // (but less costly, saves a couple of lookups)
                const double* pv_bkp = pv[f];
                pv[f] = p;
                orient[f] = PCK::orient_3d(pv[0], pv[1], pv[2], pv[3]);

                //   If the orientation is not negative, then we cannot
                // walk towards t_next, and examine the next candidate
                // (or exit the loop if they are exhausted).
                if(orient[f] != NEGATIVE) {
                    pv[f] = pv_bkp;
                    continue;
                }

                //  If the opposite tet is a virtual tet, then
                // the point has a positive orientation relative
                // to the facet on the border of the convex hull,
                // thus t_next is a tet in conflict and we are
                // done.
                if(tet_is_virtual(t_next)) {
                    if(thread_safe) {
                        Process::release_spinlock(lock);
                    }
                    for(index_t lf = 0; lf < 4; ++lf) {
                        orient[lf] = POSITIVE;
                    }
                    return t_next;
                }

                //   If we reach this point, then t_next is a valid
                // successor, thus we are still walking.
                t_pred = t;
                t = t_next;
                goto still_walking;
            }
        } 

        //   If we reach this point, we did not find a valid successor
        // for walking (a face for which p has negative orientation), 
        // thus we reached the tet for which p has all positive 
        // face orientations (i.e. the tet that contains p).

        if(thread_safe) {
            Process::release_spinlock(lock);
        }
        return t;
    }